

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgGoogol.cpp
# Opt level: O3

void __thiscall dgGoogol::NegateMantissa(dgGoogol *this,HaU64 *mantissa)

{
  long lVar1;
  HaI32 i;
  long lVar2;
  HaU64 HVar3;
  bool bVar4;
  
  lVar1 = 1;
  lVar2 = 3;
  do {
    HVar3 = ~mantissa[lVar2] + lVar1;
    if (HVar3 != 0) {
      lVar1 = 0;
    }
    mantissa[lVar2] = HVar3;
    bVar4 = lVar2 != 0;
    lVar2 = lVar2 + -1;
  } while (bVar4);
  return;
}

Assistant:

void dgGoogol::NegateMantissa (hacd::HaU64* const mantissa) const
{
	hacd::HaU64 carrier = 1;
	for (hacd::HaI32 i = DG_GOOGOL_SIZE - 1; i >= 0; i --) {
		hacd::HaU64 a = ~mantissa[i] + carrier;
		if (a) {
			carrier = 0;
		}
		mantissa[i] = a;
	}
}